

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrVec2f
          (X3DImporter *this,int pAttrIdx,
          vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pValue)

{
  _List_node_base *p_Var1;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> tlist;
  _List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_30;
  
  local_30._M_impl._M_node._M_size = 0;
  local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
  local_30._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_30;
  XML_ReadNode_GetAttrVal_AsListVec2f
            (this,pAttrIdx,(list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_30
            );
  if (local_30._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_30) {
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve
              (pValue,local_30._M_impl._M_node._M_size);
    p_Var1 = (_List_node_base *)&local_30;
    while (p_Var1 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                     &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&local_30) {
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
                (pValue,(value_type *)(p_Var1 + 1));
    }
  }
  std::__cxx11::_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::_M_clear
            (&local_30);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrVec2f(const int pAttrIdx, std::vector<aiVector2D>& pValue)
{
    std::list<aiVector2D> tlist;

	XML_ReadNode_GetAttrVal_AsListVec2f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
        for ( std::list<aiVector2D>::iterator it = tlist.begin(); it != tlist.end(); ++it )
        {
            pValue.push_back( *it );
        }
	}
}